

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_init_vfs(ma_vfs *pVFS,char *pFilePath,ma_decoder_config *pConfig,
                             ma_decoder *pDecoder)

{
  ma_vfs_file file;
  ma_result mVar1;
  ma_bool32 mVar2;
  ma_decoder_config *pConfig_00;
  ma_decoder *pDecoder_00;
  ma_decoder_config config;
  ma_decoder_config config_1;
  
  pDecoder_00 = (ma_decoder *)&config;
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(&config_1,0,0x90);
  }
  else {
    memcpy(&config_1,pConfig,0x90);
  }
  memcpy(&config,&config_1,0x90);
  mVar1 = ma_decoder__preinit(ma_decoder__on_read_vfs,ma_decoder__on_seek_vfs,
                              ma_decoder__on_tell_vfs,(void *)0x0,&config,pDecoder);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (pFilePath == (char *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (*pFilePath == '\0') {
    return MA_INVALID_ARGS;
  }
  mVar1 = ma_vfs_or_default_open(pVFS,pFilePath,1,(ma_vfs_file *)&config_1);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  (pDecoder->data).vfs.pVFS = pVFS;
  (pDecoder->data).vfs.file = (ma_vfs_file)config_1._0_8_;
  pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
  if (config.encodingFormat == ma_encoding_format_unknown) {
LAB_0014fd0e:
    mVar1 = ma_decoder_init_custom__internal(&config,pDecoder);
    if (mVar1 != MA_SUCCESS) {
      ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      if (config.encodingFormat != ma_encoding_format_unknown) {
        return MA_NO_BACKEND;
      }
      mVar2 = ma_path_extension_equal(pFilePath,"wav");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_wav__internal(&config,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_0014fdef;
        ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      }
      mVar2 = ma_path_extension_equal(pFilePath,"flac");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_flac__internal(&config,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_0014fdef;
        ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      }
      mVar2 = ma_path_extension_equal(pFilePath,"mp3");
      if (mVar2 != 0) {
        mVar1 = ma_decoder_init_mp3__internal(&config,pDecoder);
        if (mVar1 == MA_SUCCESS) goto LAB_0014fdef;
        ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      }
      mVar1 = ma_decoder_init__internal
                        (ma_decoder__on_seek_vfs,(ma_decoder_seek_proc)&config,pDecoder,pConfig_00,
                         pDecoder_00);
      goto LAB_0014fdfa;
    }
    if (config.encodingFormat != ma_encoding_format_unknown) {
      return MA_NO_BACKEND;
    }
  }
  else {
    mVar1 = MA_NO_BACKEND;
    if (config.encodingFormat == ma_encoding_format_wav) {
      mVar1 = ma_decoder_init_wav__internal(&config,pDecoder);
      pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
    }
    if ((int)pConfig_00 == 2) {
      mVar1 = ma_decoder_init_flac__internal(&config,pDecoder);
      pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
    }
    if ((int)pConfig_00 == 3) {
      mVar1 = ma_decoder_init_mp3__internal(&config,pDecoder);
      pConfig_00 = (ma_decoder_config *)(ulong)config.encodingFormat;
    }
    if ((int)pConfig_00 == 4) {
      mVar1 = ma_decoder_init_vorbis__internal(&config,pDecoder);
    }
    if (mVar1 != MA_SUCCESS) {
      ma_decoder__on_seek_vfs(pDecoder,0,ma_seek_origin_start);
      goto LAB_0014fd0e;
    }
  }
LAB_0014fdef:
  mVar1 = ma_decoder__postinit(&config,pDecoder);
LAB_0014fdfa:
  if (mVar1 == MA_SUCCESS) {
    mVar1 = MA_SUCCESS;
  }
  else {
    file = (pDecoder->data).vfs.file;
    if (file != (ma_vfs_file)0x0) {
      ma_vfs_or_default_close(pVFS,file);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_init_vfs(ma_vfs* pVFS, const char* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_vfs(pVFS, pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(&config, pDecoder);
        }
    #endif

        /* Make sure we seek back to the start if we didn't initialize a decoder successfully so the next attempts have a fresh start. */
        if (result != MA_SUCCESS) {
            ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "wav")) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "flac")) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal(pFilePath, "mp3")) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    /* If we still haven't got a result just use trial and error. Otherwise we can finish up. */
    if (result != MA_SUCCESS) {
        result = ma_decoder_init__internal(ma_decoder__on_read_vfs, ma_decoder__on_seek_vfs, NULL, &config, pDecoder);
    } else {
        result = ma_decoder__postinit(&config, pDecoder);
    }

    if (result != MA_SUCCESS) {
        if (pDecoder->data.vfs.file != NULL) {   /* <-- Will be reset to NULL if ma_decoder_uninit() is called in one of the steps above which allows us to avoid a double close of the file. */
            ma_vfs_or_default_close(pVFS, pDecoder->data.vfs.file);
        }

        return result;
    }

    return MA_SUCCESS;
}